

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>::
Action(Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> *this,
      ActionInterface<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
      *impl)

{
  ActionAdapter local_28;
  ActionInterface<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *local_18;
  ActionInterface<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *impl_local;
  Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset_const&)>>
  ::
  shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset_const&)>,void>
            ((shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset_const&)>>
              *)&local_28,impl);
  std::function<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset_const&)>::
  function<testing::Action<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset_const&)>::ActionAdapter,void>
            ((function<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset_const&)> *
             )this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}